

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O1

_Bool get_move_find_safety(monster *mon)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint16_t **ppuVar3;
  wchar_t wVar4;
  _Bool _Var5;
  wchar_t wVar6;
  loc_conflict grid2;
  loc grid;
  wchar_t x;
  int iVar7;
  long lVar8;
  ulong uVar9;
  _Bool _Var10;
  wchar_t local_58;
  loc local_50;
  ulong local_48;
  
  local_58 = L'\0';
  iVar7 = 1;
  _Var10 = true;
  uVar9 = 1;
  while( true ) {
    local_50 = (loc)loc(0,0);
    local_48 = (ulong)local_50 >> 0x20;
    pwVar1 = dist_offsets_y[uVar9];
    pwVar2 = dist_offsets_x[uVar9];
    wVar6 = *pwVar1;
    x = *pwVar2;
    wVar4 = local_50.y;
    if (x != L'\0' || wVar6 != L'\0') {
      lVar8 = 4;
      do {
        grid2 = loc(x,wVar6);
        grid = (loc)loc_sum(mon->grid,grid2);
        _Var5 = square_in_bounds_fully(cave,grid);
        if ((((_Var5) && (_Var5 = square_ispassable(cave,grid), _Var5)) &&
            (ppuVar3 = (cave->noise).grids,
            (uint)ppuVar3[(long)grid >> 0x20][grid.x] <=
            (uint)ppuVar3[(mon->grid).y][(mon->grid).x] + iVar7 * 2)) &&
           (((_Var5 = monster_hates_grid(mon,(loc_conflict)grid), !_Var5 &&
             (_Var5 = square_isview(cave,grid), !_Var5)) &&
            (wVar6 = distance((loc_conflict)grid,player->grid), local_58 < wVar6)))) {
          local_48 = (ulong)grid >> 0x20;
          local_58 = wVar6;
          local_50 = grid;
        }
        wVar6 = *(wchar_t *)((long)pwVar1 + lVar8);
        x = *(wchar_t *)((long)pwVar2 + lVar8);
        lVar8 = lVar8 + 4;
        wVar4 = (wchar_t)local_48;
      } while (wVar6 != L'\0' || x != L'\0');
    }
    local_48._0_4_ = wVar4;
    if (L'\0' < local_58) break;
    iVar7 = iVar7 + 1;
    _Var10 = uVar9 < 9;
    uVar9 = uVar9 + 1;
    if (uVar9 == 10) {
      return _Var10;
    }
  }
  (mon->target).grid.x = local_50.x;
  (mon->target).grid.y = (wchar_t)local_48;
  return _Var10;
}

Assistant:

static bool get_move_find_safety(struct monster *mon)
{
	int i, dy, dx, d, dis, gdis = 0;

	const int *y_offsets;
	const int *x_offsets;

	/* Start with adjacent locations, spread further */
	for (d = 1; d < 10; d++) {
		struct loc best = loc(0, 0);

		/* Get the lists of points with a distance d from (fx, fy) */
		y_offsets = dist_offsets_y[d];
		x_offsets = dist_offsets_x[d];

		/* Check the locations */
		for (i = 0, dx = x_offsets[0], dy = y_offsets[0];
		     dx != 0 || dy != 0;
		     i++, dx = x_offsets[i], dy = y_offsets[i]) {
			struct loc grid = loc_sum(mon->grid, loc(dx, dy));

			/* Skip illegal locations */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip locations in a wall */
			if (!square_ispassable(cave, grid)) continue;

			/* Ignore too-distant grids */
			if (cave->noise.grids[grid.y][grid.x] >
				cave->noise.grids[mon->grid.y][mon->grid.x] + 2 * d)
				continue;

			/* Ignore damaging terrain if they can't handle it */
			if (monster_hates_grid(mon, grid)) continue;

			/* Check for absence of shot (more or less) */
			if (!square_isview(cave, grid)) {
				/* Calculate distance from player */
				dis = distance(grid, player->grid);

				/* Remember if further than previous */
				if (dis > gdis) {
					best = grid;
					gdis = dis;
				}
			}
		}

		/* Check for success */
		if (gdis > 0) {
			/* Good location */
			mon->target.grid = best;
			return (true);
		}
	}

	/* No safe place */
	return (false);
}